

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O1

void * isotree_deserialize_from_file(FILE *serialized_model,int nthreads)

{
  tuple<isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_> this;
  _Head_base<0UL,_isotree::IsolationForest_*,_false> _Var1;
  __single_object out;
  __uniq_ptr_impl<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
  local_1f8;
  IsolationForest local_1f0;
  
  if (serialized_model == (FILE *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Passed invalid file handle to \'isotree_deserialize_from_file\'.",0x3e);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    _Var1._M_head_impl = (IsolationForest *)0x0;
  }
  else {
    isotree::IsolationForest::deserialize(&local_1f0,serialized_model,nthreads);
    this.
    super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
    .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
          )operator_new(0x1d8);
    isotree::IsolationForest::IsolationForest
              ((IsolationForest *)
               this.
               super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
               .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl,&local_1f0);
    local_1f8._M_t.
    super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
    .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl =
         (tuple<isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>)
         (tuple<isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>)
         this.
         super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
         .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl;
    isotree::IsolationForest::~IsolationForest(&local_1f0);
    _Var1._M_head_impl =
         (IsolationForest *)
         local_1f8._M_t.
         super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
         .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl;
    local_1f8._M_t.
    super__Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
    .super__Head_base<0UL,_isotree::IsolationForest_*,_false>._M_head_impl =
         (tuple<isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>)
         (_Tuple_impl<0UL,_isotree::IsolationForest_*,_std::default_delete<isotree::IsolationForest>_>
          )0x0;
    std::unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>::
    ~unique_ptr((unique_ptr<isotree::IsolationForest,_std::default_delete<isotree::IsolationForest>_>
                 *)&local_1f8);
  }
  return (_Head_base<0UL,_isotree::IsolationForest_*,_false>)_Var1._M_head_impl;
}

Assistant:

ISOTREE_EXPORTED
void* isotree_deserialize_from_file(FILE *serialized_model, int nthreads)
{
    if (!serialized_model) {
        cerr << "Passed invalid file handle to 'isotree_deserialize_from_file'." << std::endl;
        return nullptr;
    }

    try
    {
        #if __cplusplus >= 201402L
        auto out = std::make_unique<IsolationForest>(IsolationForest::deserialize(serialized_model, nthreads));
        #else
        std::unique_ptr<IsolationForest> out(new IsolationForest(std::forward<IsolationForest>(
            IsolationForest::deserialize(serialized_model, nthreads)
        )));
        #endif
        return (void*)out.release();
    }

    catch (std::exception &e)
    {
        cerr << e.what();
        cerr.flush();
        return nullptr;
    }
}